

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

unique_ptr<Catch::IStream> Catch::makeStream(string *filename)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ulong in_RSI;
  IStream *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream> *from;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream> local_80;
  undefined1 local_71;
  ulong local_10;
  
  local_10 = in_RSI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) != 0) ||
     (bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28), bVar1))
  {
    Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>();
    Detail::unique_ptr<Catch::IStream>::
    unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream,void>
              ((unique_ptr<Catch::IStream> *)in_stack_ffffffffffffff30,
               (unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)
               in_stack_ffffffffffffff28);
    Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::~unique_ptr
              ((unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)
               in_stack_ffffffffffffff30);
    return (unique_ptr<Catch::IStream>)in_RDI;
  }
  pcVar3 = (char *)std::__cxx11::string::operator[](local_10);
  if (*pcVar3 != '%') {
    from = &local_80;
    Detail::
    make_unique<Catch::Detail::(anonymous_namespace)::FileStream,std::__cxx11::string_const&>
              (in_stack_ffffffffffffff48);
    Detail::unique_ptr<Catch::IStream>::
    unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream,void>
              ((unique_ptr<Catch::IStream> *)in_stack_ffffffffffffff30,from);
    Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream>::~unique_ptr
              ((unique_ptr<Catch::Detail::(anonymous_namespace)::FileStream> *)
               in_stack_ffffffffffffff30);
    return (unique_ptr<Catch::IStream>)in_RDI;
  }
  bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
  if (!bVar1) {
    bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    if (bVar1) {
      Detail::make_unique<Catch::Detail::(anonymous_namespace)::CerrStream>();
      Detail::unique_ptr<Catch::IStream>::
      unique_ptr<Catch::Detail::(anonymous_namespace)::CerrStream,void>
                ((unique_ptr<Catch::IStream> *)in_stack_ffffffffffffff30,
                 (unique_ptr<Catch::Detail::(anonymous_namespace)::CerrStream> *)
                 in_stack_ffffffffffffff28);
      Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CerrStream>::~unique_ptr
                ((unique_ptr<Catch::Detail::(anonymous_namespace)::CerrStream> *)
                 in_stack_ffffffffffffff30);
      return (unique_ptr<Catch::IStream>)in_RDI;
    }
    bVar1 = std::operator==(in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    if (bVar1) {
      Detail::make_unique<Catch::Detail::(anonymous_namespace)::CoutStream>();
      Detail::unique_ptr<Catch::IStream>::
      unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream,void>
                ((unique_ptr<Catch::IStream> *)in_stack_ffffffffffffff30,
                 (unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)
                 in_stack_ffffffffffffff28);
      Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream>::~unique_ptr
                ((unique_ptr<Catch::Detail::(anonymous_namespace)::CoutStream> *)
                 in_stack_ffffffffffffff30);
      return (unique_ptr<Catch::IStream>)in_RDI;
    }
    ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_ffffffffffffff30);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_ffffffffffffff30,
               (char (*) [23])in_stack_ffffffffffffff28);
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    local_71 = 0x27;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_ffffffffffffff30,(char *)in_stack_ffffffffffffff28);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_ffffffffffffff28);
    throw_domain_error(in_stack_ffffffffffffff50);
  }
  Detail::make_unique<Catch::Detail::(anonymous_namespace)::DebugOutStream>();
  Detail::unique_ptr<Catch::IStream>::
  unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream,void>
            ((unique_ptr<Catch::IStream> *)in_stack_ffffffffffffff30,
             (unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream> *)
             in_stack_ffffffffffffff28);
  Detail::unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream>::~unique_ptr
            ((unique_ptr<Catch::Detail::(anonymous_namespace)::DebugOutStream> *)
             in_stack_ffffffffffffff30);
  return (unique_ptr<Catch::IStream>)in_RDI;
}

Assistant:

auto makeStream( std::string const& filename ) -> Detail::unique_ptr<IStream> {
        if ( filename.empty() || filename == "-" ) {
            return Detail::make_unique<Detail::CoutStream>();
        }
        if( filename[0] == '%' ) {
            if ( filename == "%debug" ) {
                return Detail::make_unique<Detail::DebugOutStream>();
            } else if ( filename == "%stderr" ) {
                return Detail::make_unique<Detail::CerrStream>();
            } else if ( filename == "%stdout" ) {
                return Detail::make_unique<Detail::CoutStream>();
            } else {
                CATCH_ERROR( "Unrecognised stream: '" << filename << '\'' );
            }
        }
        return Detail::make_unique<Detail::FileStream>( filename );
    }